

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O2

void __thiscall chrono::ChMatterSPH::ArchiveOUT(ChMatterSPH *this,ChArchiveOut *marchive)

{
  ChNameValue<std::vector<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>_>
  local_78;
  ChNameValue<bool> local_60;
  ChNameValue<std::shared_ptr<chrono::ChMaterialSurface>_> local_48;
  ChNameValue<chrono::ChContinuumSPH> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChMatterSPH>(marchive);
  ChIndexedNodes::ArchiveOUT(&this->super_ChIndexedNodes,marchive);
  local_30._value = &this->material;
  local_30._name = "material";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->matsurface;
  local_48._name = "matsurface";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  local_60._value = &this->do_collide;
  local_60._name = "do_collide";
  local_60._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_60);
  local_78._value = &this->nodes;
  local_78._name = "nodes";
  local_78._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_78);
  return;
}

Assistant:

void ChMatterSPH::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChMatterSPH>();

    // serialize parent class
    ChIndexedNodes::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(material);
    marchive << CHNVP(matsurface);
    marchive << CHNVP(do_collide);
    marchive << CHNVP(nodes);
}